

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::AddConstraintInfo::Deserialize(AddConstraintInfo *this,Deserializer *deserializer)

{
  tuple<duckdb::AddConstraintInfo_*,_std::default_delete<duckdb::AddConstraintInfo>_> this_00;
  pointer pAVar1;
  __uniq_ptr_impl<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_duckdb::AddConstraintInfo_*,_std::default_delete<duckdb::AddConstraintInfo>_>
  .super__Head_base<0UL,_duckdb::AddConstraintInfo_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::AddConstraintInfo_*,_std::default_delete<duckdb::AddConstraintInfo>_>
        )operator_new(0x80);
  AddConstraintInfo((AddConstraintInfo *)
                    this_00.
                    super__Tuple_impl<0UL,_duckdb::AddConstraintInfo_*,_std::default_delete<duckdb::AddConstraintInfo>_>
                    .super__Head_base<0UL,_duckdb::AddConstraintInfo_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_duckdb::AddConstraintInfo_*,_std::default_delete<duckdb::AddConstraintInfo>_>
  .super__Head_base<0UL,_duckdb::AddConstraintInfo_*,_false>._M_head_impl =
       (tuple<duckdb::AddConstraintInfo_*,_std::default_delete<duckdb::AddConstraintInfo>_>)
       (tuple<duckdb::AddConstraintInfo_*,_std::default_delete<duckdb::AddConstraintInfo>_>)
       this_00.
       super__Tuple_impl<0UL,_duckdb::AddConstraintInfo_*,_std::default_delete<duckdb::AddConstraintInfo>_>
       .super__Head_base<0UL,_duckdb::AddConstraintInfo_*,_false>._M_head_impl;
  pAVar1 = unique_ptr<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>,_true>
           ::operator->((unique_ptr<duckdb::AddConstraintInfo,_std::default_delete<duckdb::AddConstraintInfo>,_true>
                         *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
            (deserializer,400,"constraint",&pAVar1->constraint);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)
       local_20._M_t.
       super__Tuple_impl<0UL,_duckdb::AddConstraintInfo_*,_std::default_delete<duckdb::AddConstraintInfo>_>
       .super__Head_base<0UL,_duckdb::AddConstraintInfo_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> AddConstraintInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<AddConstraintInfo>(new AddConstraintInfo());
	deserializer.ReadPropertyWithDefault<unique_ptr<Constraint>>(400, "constraint", result->constraint);
	return std::move(result);
}